

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_ReaderRequestStepHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  long lVar1;
  StepRequest p_Var2;
  SstStream in_RDX;
  StepRequest Last;
  StepRequest Request;
  size_t NextTS;
  int i;
  int RequestingReader;
  CPTimestepList List;
  SstStream Stream;
  WS_ReaderInfo CP_WSR_Stream;
  _ReaderRequestStepMsg *Msg;
  StepRequest local_68;
  SstStream in_stack_ffffffffffffffa0;
  int local_50;
  int local_4c;
  _CPTimestepEntry *p_Var3;
  SstStream s;
  WS_ReaderInfo Entry;
  
  Entry = (WS_ReaderInfo)in_RDX->CPInfo;
  s = Entry->ParentStream;
  CP_verbose(Entry->ParentStream,PerStepVerbose,
             "Reader Request Step  message received for Stream %p.\n",Entry);
  pthread_mutex_lock((pthread_mutex_t *)&Entry->ParentStream->DataLock);
  p_Var3 = s->QueuedTimesteps;
  if (s->CloseMessagesSent == 0) {
    local_4c = -1;
    for (local_50 = 0; local_50 < s->ReaderCount; local_50 = local_50 + 1) {
      if (Entry == s->Readers[local_50]) {
        local_4c = local_50;
      }
    }
    if (local_4c == -1) {
      CP_verbose(s,TraceVerbose,"In RequestStepHandler, RequestingReader not found, ignore\n");
      pthread_mutex_unlock((pthread_mutex_t *)&Entry->ParentStream->DataLock);
    }
    else {
      while (p_Var3 != (CPTimestepList)0x0) {
        lVar1 = s->LastDemandTimestep + 1;
        CP_verbose(s,TraceVerbose,"In RequestStepHandler, trying to send TS %ld, examining TS %ld\n"
                   ,lVar1,p_Var3->Timestep);
        if (Entry->ReaderStatus != Established) break;
        if ((p_Var3->Timestep == lVar1) && (p_Var3->InProgressFlag == 0)) {
          if ((p_Var3->Expired == 0) || (p_Var3->PreciousTimestep != 0)) {
            CP_verbose(s,PerStepVerbose,
                       "Sending Queued TimestepMetadata for timestep %ld, reference count = %d\n",
                       lVar1,(ulong)(uint)p_Var3->ReferenceCount);
            s->LastDemandTimestep = p_Var3->Timestep;
            SendTimestepEntryToSingleReader
                      (in_RDX,(CPTimestepList)Entry,(WS_ReaderInfo)s,(int)((ulong)p_Var3 >> 0x20));
            if (s->LastDemandTimestep == s->CloseTimestepCount) {
              SendCloseMsgs(in_stack_ffffffffffffffa0);
            }
            pthread_mutex_unlock((pthread_mutex_t *)&Entry->ParentStream->DataLock);
            return;
          }
          CP_verbose(s,TraceVerbose,
                     "Reader send queued skipping  TS %ld, expired and not precious\n",
                     p_Var3->Timestep,lVar1);
          p_Var3 = p_Var3->Next;
        }
        else {
          p_Var3 = p_Var3->Next;
        }
      }
      CP_verbose(s,TraceVerbose,"In RequestStepHandler, queueing request\n");
      p_Var2 = (StepRequest)calloc(0x10,1);
      p_Var2->RequestingReader = local_4c;
      if (s->StepRequestQueue == (StepRequest)0x0) {
        s->StepRequestQueue = p_Var2;
      }
      else {
        for (local_68 = s->StepRequestQueue; local_68->Next != (_StepRequest *)0x0;
            local_68 = local_68->Next) {
        }
        local_68->Next = p_Var2;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&Entry->ParentStream->DataLock);
    }
  }
  else {
    CP_verbose(s,TraceVerbose,"In RequestStepHandler, stream closing, ignore\n");
    pthread_mutex_unlock((pthread_mutex_t *)&Entry->ParentStream->DataLock);
  }
  return;
}

Assistant:

void CP_ReaderRequestStepHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                                 attr_list attrs)
{
    struct _ReaderRequestStepMsg *Msg = (struct _ReaderRequestStepMsg *)Msg_v;

    WS_ReaderInfo CP_WSR_Stream = Msg->WSR_Stream;
    SstStream Stream = CP_WSR_Stream->ParentStream;
    CP_verbose(CP_WSR_Stream->ParentStream, PerStepVerbose,
               "Reader Request Step  message received "
               "for Stream %p.\n",
               CP_WSR_Stream);
    if (CP_WSR_Stream->ParentStream->ConfigParams->CPCommPattern == SstCPCommPeer)
    {
        assert(0);
    }

    STREAM_MUTEX_LOCK(CP_WSR_Stream->ParentStream);
    CPTimestepList List = Stream->QueuedTimesteps;
    if (Stream->CloseMessagesSent)
    {
        CP_verbose(Stream, TraceVerbose, "In RequestStepHandler, stream closing, ignore\n");
        STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
        return;
    }
    int RequestingReader = -1;
    for (int i = 0; i < Stream->ReaderCount; i++)
    {
        if (CP_WSR_Stream == Stream->Readers[i])
        {
            RequestingReader = i;
        }
    }
    if (RequestingReader == -1)
    {
        CP_verbose(Stream, TraceVerbose,
                   "In RequestStepHandler, RequestingReader not found, ignore\n");
        STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
        return;
    }

    while (List)
    {
        size_t NextTS = Stream->LastDemandTimestep + 1;
        CP_verbose(Stream, TraceVerbose,
                   "In RequestStepHandler, trying to send TS %ld, examining TS %ld\n", NextTS,
                   List->Timestep);
        if (CP_WSR_Stream->ReaderStatus != Established)
        {
            break; /* break out of while if we've fallen out of established
                    */
        }
        if ((List->Timestep == NextTS) && !List->InProgressFlag)
        {
            if (List->Expired && !List->PreciousTimestep)
            {
                CP_verbose(Stream, TraceVerbose,
                           "Reader send queued skipping  TS %ld, expired "
                           "and not precious\n",
                           List->Timestep, NextTS);
                List = List->Next;
                continue; /* skip timestep is expired, but not
                             precious */
            }
            CP_verbose(Stream, PerStepVerbose,
                       "Sending Queued TimestepMetadata for timestep %ld, "
                       "reference count = %d\n",
                       NextTS, List->ReferenceCount);

            Stream->LastDemandTimestep = List->Timestep;
            SendTimestepEntryToSingleReader(Stream, List, CP_WSR_Stream, RequestingReader);
            if (Stream->LastDemandTimestep == Stream->CloseTimestepCount)
            {
                /* send if all timesteps have been send OnDemand */
                SendCloseMsgs(Stream);
            }
            STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
            return;
        }
        List = List->Next;
    }

    CP_verbose(Stream, TraceVerbose, "In RequestStepHandler, queueing request\n");
    StepRequest Request = calloc(sizeof(*Request), 1);
    Request->RequestingReader = RequestingReader;
    if (!Stream->StepRequestQueue)
    {
        Stream->StepRequestQueue = Request;
    }
    else
    {
        StepRequest Last = Stream->StepRequestQueue;
        while (Last->Next)
            Last = Last->Next;
        Last->Next = Request;
    }
    STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
}